

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O2

int file_read(file_t *file,uchar *buf,size_t size)

{
  uint uVar1;
  char *__assertion;
  
  if (file == (file_t *)0x0) {
    __assertion = "file != NULL";
    uVar1 = 0x18;
  }
  else if (buf == (uchar *)0x0) {
    __assertion = "buf != NULL";
    uVar1 = 0x19;
  }
  else {
    if (size != 0) {
      uVar1 = unix_read(file->fd,buf,size);
      if (0 < (int)uVar1) {
        file->pos = file->pos + (ulong)uVar1;
      }
      return uVar1;
    }
    __assertion = "size > 0";
    uVar1 = 0x1a;
  }
  __assert_fail(__assertion,"/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/file.c",
                uVar1,"int file_read(file_t *, unsigned char *, size_t)");
}

Assistant:

int file_read(file_t *file, unsigned char *buf, size_t size) {
  assert(file != NULL);
  assert(buf != NULL);
  assert(size > 0);

  int res = unix_read(file->fd, buf, size);
  if (res > 0) {
    file->pos += res;
  }
  return res;
}